

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

char * spirv_cross::CompilerGLSL::vector_swizzle(int vecsize,int index)

{
  if (3 < vecsize - 1U) {
    __assert_fail("vecsize >= 1 && vecsize <= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                  ,0x125,"static const char *spirv_cross::CompilerGLSL::vector_swizzle(int, int)");
  }
  if ((uint)index < 4) {
    if (vector_swizzle::swizzle[vecsize - 1U][(uint)index] != (char *)0x0) {
      return vector_swizzle::swizzle[vecsize - 1U][(uint)index];
    }
    __assert_fail("swizzle[vecsize - 1][index]",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                  ,0x127,"static const char *spirv_cross::CompilerGLSL::vector_swizzle(int, int)");
  }
  __assert_fail("index >= 0 && index < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                ,0x126,"static const char *spirv_cross::CompilerGLSL::vector_swizzle(int, int)");
}

Assistant:

const char *CompilerGLSL::vector_swizzle(int vecsize, int index)
{
	static const char *const swizzle[4][4] = {
		{ ".x", ".y", ".z", ".w" },
		{ ".xy", ".yz", ".zw", nullptr },
		{ ".xyz", ".yzw", nullptr, nullptr },
#if defined(__GNUC__) && (__GNUC__ == 9)
		// This works around a GCC 9 bug, see details in https://gcc.gnu.org/bugzilla/show_bug.cgi?id=90947.
		// This array ends up being compiled as all nullptrs, tripping the assertions below.
		{ "", nullptr, nullptr, "$" },
#else
		{ "", nullptr, nullptr, nullptr },
#endif
	};

	assert(vecsize >= 1 && vecsize <= 4);
	assert(index >= 0 && index < 4);
	assert(swizzle[vecsize - 1][index]);

	return swizzle[vecsize - 1][index];
}